

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O0

uint64_t rnd64_r(rng_t *state)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t t;
  uint64_t result;
  uint64_t *s;
  rng_t *state_local;
  
  uVar1 = rotl((*state)[1] * 5,7);
  uVar2 = (*state)[1];
  (*state)[2] = (*state)[0] ^ (*state)[2];
  (*state)[3] = (*state)[1] ^ (*state)[3];
  (*state)[1] = (*state)[2] ^ (*state)[1];
  (*state)[0] = (*state)[3] ^ (*state)[0];
  (*state)[2] = uVar2 << 0x11 ^ (*state)[2];
  uVar2 = rotl((*state)[3],0x2d);
  (*state)[3] = uVar2;
  return uVar1 * 9;
}

Assistant:

uint64_t
rnd64_r(rng_t *state)
{
	uint64_t *s = (void *)state;

	const uint64_t result = rotl(s[1] * 5, 7) * 9;
	const uint64_t t = s[1] << 17;

	s[2] ^= s[0];
	s[3] ^= s[1];
	s[1] ^= s[2];
	s[0] ^= s[3];

	s[2] ^= t;

	s[3] = rotl(s[3], 45);

	return result;
}